

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::convert_arg_for_ini
                   (string *arg,char stringQuote,char literalQuote,bool disable_multi_line)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  byte *pbVar5;
  char *pcVar6;
  char in_CL;
  char in_DL;
  string *in_RSI;
  string *in_RDI;
  byte in_R8B;
  string *in_stack_00000048;
  double val;
  char *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  char __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  allocator *paVar7;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined1 local_211 [33];
  string local_1f0 [32];
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [32];
  string local_188 [39];
  allocator local_161;
  string local_160 [16];
  double *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  string local_140 [40];
  undefined8 local_118;
  undefined8 local_110;
  char *local_108;
  undefined8 local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined8 local_d8;
  undefined8 local_d0;
  char *local_c8;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [39];
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  undefined8 local_30;
  allocator local_14;
  byte local_13;
  char local_12;
  char local_11;
  string *local_10;
  
  local_13 = in_R8B & 1;
  local_12 = in_CL;
  local_11 = in_DL;
  local_10 = in_RSI;
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                              in_stack_fffffffffffffd78);
    if ((((bVar1) ||
         (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                                    ,in_stack_fffffffffffffd78), bVar1)) ||
        (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                                   in_stack_fffffffffffffd78), bVar1)) ||
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                                  in_stack_fffffffffffffd78), bVar1)) {
      ::std::__cxx11::string::string((string *)in_RDI,local_10);
    }
    else {
      iVar2 = ::std::__cxx11::string::compare((ulong)local_10,0,(char *)0x2);
      if ((iVar2 != 0) &&
         (iVar2 = ::std::__cxx11::string::compare((ulong)local_10,0,(char *)0x2), iVar2 != 0)) {
        local_30 = 0;
        bVar1 = lexical_cast<double,_(CLI::detail::enabler)0>
                          (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        if ((bVar1) &&
           (lVar4 = ::std::__cxx11::string::find_first_not_of((char *)local_10,0x18fea4),
           lVar4 == -1)) {
          ::std::__cxx11::string::string((string *)in_RDI,local_10);
          return in_RDI;
        }
      }
      lVar4 = ::std::__cxx11::string::size();
      if (lVar4 == 1) {
        pbVar5 = (byte *)::std::__cxx11::string::front();
        iVar2 = isprint((uint)*pbVar5);
        if (iVar2 == 0) {
          binary_escape_string(in_stack_00000048);
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                                    ,in_stack_fffffffffffffd78);
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_70,1,local_11,&local_71);
            ::std::operator+(in_stack_fffffffffffffd88,
                             (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            ::std::operator+(in_stack_fffffffffffffd88,
                             (char)((uint)in_stack_fffffffffffffd84 >> 0x18));
            ::std::__cxx11::string::~string(local_50);
            ::std::__cxx11::string::~string(local_70);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
          }
          else {
            paVar7 = &local_b9;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_b8,1,local_12,paVar7);
            ::std::operator+(in_stack_fffffffffffffd88,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
            ::std::operator+(in_stack_fffffffffffffd88,
                             (char)((uint)in_stack_fffffffffffffd84 >> 0x18));
            ::std::__cxx11::string::~string(local_98);
            ::std::__cxx11::string::~string(local_b8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          }
        }
      }
      else {
        pcVar6 = (char *)::std::__cxx11::string::front();
        if (*pcVar6 == '0') {
          pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_10);
          if (*pcVar6 == 'x') {
            local_d0 = ::std::__cxx11::string::begin();
            local_c8 = (char *)__gnu_cxx::
                               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)in_stack_fffffffffffffd88,
                                           CONCAT44(in_stack_fffffffffffffd84,
                                                    in_stack_fffffffffffffd80));
            local_d8 = ::std::__cxx11::string::end();
            bVar1 = ::std::
                    all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_1_>
                              (local_c8,local_d8);
            if (bVar1) {
              ::std::__cxx11::string::string((string *)in_RDI,local_10);
              return in_RDI;
            }
          }
          else {
            pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_10);
            if (*pcVar6 == 'o') {
              local_f0 = ::std::__cxx11::string::begin();
              local_e8 = (char *)__gnu_cxx::
                                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)in_stack_fffffffffffffd88,
                                             CONCAT44(in_stack_fffffffffffffd84,
                                                      in_stack_fffffffffffffd80));
              local_f8 = ::std::__cxx11::string::end();
              bVar1 = ::std::
                      all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_2_>
                                (local_e8,local_f8);
              if (bVar1) {
                ::std::__cxx11::string::string((string *)in_RDI,local_10);
                return in_RDI;
              }
            }
            else {
              pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_10);
              if (*pcVar6 == 'b') {
                local_110 = ::std::__cxx11::string::begin();
                local_108 = (char *)__gnu_cxx::
                                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)in_stack_fffffffffffffd88,
                                                CONCAT44(in_stack_fffffffffffffd84,
                                                         in_stack_fffffffffffffd80));
                local_118 = ::std::__cxx11::string::end();
                bVar1 = ::std::
                        all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_3_>
                                  (local_108,local_118);
                if (bVar1) {
                  ::std::__cxx11::string::string((string *)in_RDI,local_10);
                  return in_RDI;
                }
              }
            }
          }
        }
        bVar1 = is_printable((string *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                            );
        if (bVar1) {
          bVar1 = has_escapable_character((string *)0x124342);
          if (bVar1) {
            uVar3 = ::std::__cxx11::string::size();
            if ((uVar3 < 0x65) || ((local_13 & 1) != 0)) {
              ::std::allocator<char>::allocator();
              __rhs = (char)((uint)in_stack_fffffffffffffd84 >> 0x18);
              ::std::__cxx11::string::string(local_1a8,1,local_11,&local_1a9);
              add_escaped_characters
                        ((string *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                               in_stack_fffffffffffffdb0);
              ::std::operator+(in_stack_fffffffffffffd88,__rhs);
              ::std::__cxx11::string::~string(local_188);
              ::std::__cxx11::string::~string(local_1d0);
              ::std::__cxx11::string::~string(local_1a8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
            }
            else {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_160,"\'\'\'",&local_161);
              ::std::operator+(in_stack_fffffffffffffd88,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
              ::std::operator+(in_stack_fffffffffffffd88,
                               (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80)
                              );
              ::std::__cxx11::string::~string(local_140);
              ::std::__cxx11::string::~string(local_160);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_161);
            }
          }
          else {
            iVar2 = (int)local_11;
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_211;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)(local_211 + 1),1,(char)iVar2,(allocator *)__lhs);
            ::std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(iVar2,in_stack_fffffffffffffd80));
            ::std::operator+(__lhs,(char)((uint)iVar2 >> 0x18));
            ::std::__cxx11::string::~string(local_1f0);
            ::std::__cxx11::string::~string((string *)(local_211 + 1));
            ::std::allocator<char>::~allocator((allocator<char> *)local_211);
          }
        }
        else {
          binary_escape_string(in_stack_00000048);
        }
      }
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,2,local_11,&local_14);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_14);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string
convert_arg_for_ini(const std::string &arg, char stringQuote, char literalQuote, bool disable_multi_line) {
    if(arg.empty()) {
        return std::string(2, stringQuote);
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        using CLI::detail::lexical_cast;
        double val = 0.0;
        if(lexical_cast(arg, val)) {
            if(arg.find_first_not_of("0123456789.-+eE") == std::string::npos) {
                return arg;
            }
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        if(isprint(static_cast<unsigned char>(arg.front())) == 0) {
            return binary_escape_string(arg);
        }
        if(arg == "'") {
            return std::string(1, stringQuote) + "'" + stringQuote;
        }
        return std::string(1, literalQuote) + arg + literalQuote;
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(!is_printable(arg)) {
        return binary_escape_string(arg);
    }
    if(detail::has_escapable_character(arg)) {
        if(arg.size() > 100 && !disable_multi_line) {
            return std::string(multiline_literal_quote) + arg + multiline_literal_quote;
        }
        return std::string(1, stringQuote) + detail::add_escaped_characters(arg) + stringQuote;
    }
    return std::string(1, stringQuote) + arg + stringQuote;
}